

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O1

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiTexture>::~TempArray
          (TempArray<std::vector,_aiTexture> *this)

{
  pointer ppaVar1;
  aiTexture *paVar2;
  mywrap *__range3;
  pointer ppaVar3;
  
  ppaVar1 = (this->arr).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar3 = (this->arr).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppaVar3 != ppaVar1; ppaVar3 = ppaVar3 + 1) {
    paVar2 = *ppaVar3;
    if (paVar2 != (aiTexture *)0x0) {
      if (paVar2->pcData != (aiTexel *)0x0) {
        operator_delete__(paVar2->pcData);
      }
      operator_delete(paVar2);
    }
  }
  ppaVar3 = (this->arr).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar3 != (pointer)0x0) {
    operator_delete(ppaVar3);
    return;
  }
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }